

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
compare(InvariantInnerTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  float fVar3;
  TessPrimitiveType TVar4;
  TestLog *pTVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  _Rb_tree_header *p_Var10;
  PerPrimitiveVec *pPVar11;
  MessageBuilder *pMVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *psVar15;
  long lVar16;
  long lVar17;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  bool bVar18;
  ulong uVar19;
  int aOrB;
  int iVar20;
  int aOrB_1;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  Triangle triangle;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e0;
  MessageBuilder local_1b0;
  
  TVar4 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
    pTVar5 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    pPVar6 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar7 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar8 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar9 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_270._M_t._M_impl.super__Rb_tree_header._M_header;
    local_270._M_t._M_impl._0_1_ = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
      uVar21 = (long)pPVar8 - (long)pPVar9;
      if (iVar20 == 0) {
        uVar21 = (long)pPVar6 - (long)pPVar7;
      }
      psVar15 = &local_270;
      if (iVar20 == 0) {
        psVar15 = &local_1e0;
      }
      uVar19 = uVar21 >> 6 & 0xffffffff;
      if ((int)(uVar21 >> 6) < 1) {
        uVar19 = 0;
      }
      for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
        pPVar11 = primitivesB;
        if (iVar20 == 0) {
          pPVar11 = primitivesA;
        }
        makeTriangle((Triangle *)&local_1b0,
                     (pPVar11->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar21);
        pMVar12 = &local_1b0;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          lVar17 = 0;
          while (lVar17 != 2) {
            fVar3 = ((Vector<float,_3> *)&pMVar12->m_log)->m_data[lVar17];
            if ((fVar3 == 0.0) && (!NAN(fVar3))) goto LAB_0070cf26;
            lVar17 = lVar17 + 1;
            if ((fVar3 == 1.0) && (!NAN(fVar3))) goto LAB_0070cf26;
          }
          pMVar12 = (MessageBuilder *)&pMVar12->field_0xc;
        }
        std::sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                  (&local_1b0,&local_1b0.field_0x24);
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(psVar15,(value_type *)&local_1b0);
LAB_0070cf26:
      }
    }
    p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      p_Var10 = &local_270._M_t._M_impl.super__Rb_tree_header;
      bVar22 = (_Rb_tree_header *)p_Var13 == p_Var1;
      bVar23 = (_Rb_tree_header *)p_Var14 == p_Var10;
      bVar18 = bVar22 && bVar23;
      if (bVar18) break;
      if (((_Rb_tree_header *)p_Var14 == p_Var10) || ((_Rb_tree_header *)p_Var13 == p_Var1)) {
LAB_0070d1c7:
        poVar2 = &local_1b0.m_str;
        local_1b0.m_log = pTVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240._M_string_length = 0;
        local_240.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_220,&local_240,", and ");
        std::operator+(&local_200,&local_220,"outer triangles");
        std::operator<<((ostream *)poVar2,(string *)&local_200);
        std::operator<<((ostream *)poVar2,")");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        if ((bVar22) ||
           ((!bVar23 &&
            (bVar22 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var13 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1),b_00), !bVar22)
            ))) {
          poVar2 = &local_1b0.m_str;
          local_1b0.m_log = pTVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
          std::operator<<((ostream *)poVar2," exists for second case but not for first");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar2 = &local_1b0.m_str;
          local_1b0.m_log = pTVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
          std::operator<<((ostream *)poVar2," exists for first case but not for second");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_0070d363;
      }
      bVar22 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
      if (bVar22) {
        bVar22 = false;
        bVar23 = false;
        goto LAB_0070d1c7;
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    }
  }
  else {
    if (TVar4 != TESSPRIMITIVETYPE_TRIANGLES) {
      return false;
    }
    pTVar5 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    pPVar6 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar7 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar8 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar9 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_270._M_t._M_impl.super__Rb_tree_header._M_header;
    local_270._M_t._M_impl._0_1_ = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
      uVar21 = (long)pPVar8 - (long)pPVar9;
      if (iVar20 == 0) {
        uVar21 = (long)pPVar6 - (long)pPVar7;
      }
      psVar15 = &local_270;
      if (iVar20 == 0) {
        psVar15 = &local_1e0;
      }
      uVar19 = uVar21 >> 6 & 0xffffffff;
      if ((int)(uVar21 >> 6) < 1) {
        uVar19 = 0;
      }
      for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
        pPVar11 = primitivesB;
        if (iVar20 == 0) {
          pPVar11 = primitivesA;
        }
        makeTriangle((Triangle *)&local_1b0,
                     (pPVar11->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar21);
        pMVar12 = &local_1b0;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          lVar17 = 0;
          while (lVar17 != 3) {
            fVar3 = ((Vector<float,_3> *)&pMVar12->m_log)->m_data[lVar17];
            lVar17 = lVar17 + 1;
            if ((fVar3 == 0.0) && (!NAN(fVar3))) goto LAB_0070cdeb;
          }
          pMVar12 = (MessageBuilder *)&pMVar12->field_0xc;
        }
        std::sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                  (&local_1b0,&local_1b0.field_0x24);
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(psVar15,(value_type *)&local_1b0);
LAB_0070cdeb:
      }
    }
    p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = local_270._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      p_Var10 = &local_270._M_t._M_impl.super__Rb_tree_header;
      bVar22 = (_Rb_tree_header *)p_Var13 == p_Var1;
      bVar23 = (_Rb_tree_header *)p_Var14 == p_Var10;
      bVar18 = bVar22 && bVar23;
      if (bVar18) break;
      if (((_Rb_tree_header *)p_Var14 == p_Var10) || ((_Rb_tree_header *)p_Var13 == p_Var1)) {
LAB_0070d024:
        poVar2 = &local_1b0.m_str;
        local_1b0.m_log = pTVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240._M_string_length = 0;
        local_240.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_220,&local_240,", and ");
        std::operator+(&local_200,&local_220,"outer triangles");
        std::operator<<((ostream *)poVar2,(string *)&local_200);
        std::operator<<((ostream *)poVar2,")");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        if ((bVar22) ||
           ((!bVar23 &&
            (bVar22 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var13 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1),b), !bVar22))))
        {
          poVar2 = &local_1b0.m_str;
          local_1b0.m_log = pTVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
          std::operator<<((ostream *)poVar2," exists for second case but not for first");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar2 = &local_1b0.m_str;
          local_1b0.m_log = pTVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
          std::operator<<((ostream *)poVar2," exists for first case but not for second");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
LAB_0070d363:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
        break;
      }
      bVar22 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
      if (bVar22) {
        bVar22 = false;
        bVar23 = false;
        goto LAB_0070d024;
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    }
  }
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&local_270);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&local_1e0);
  return bVar18;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}